

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O0

void __thiscall
TPZInterpolationSpace::ReallyComputeSolutionT<double>
          (TPZInterpolationSpace *this,TPZMaterialDataT<double> *data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TPZBaseMatrix *this_00;
  TPZVec<TPZManVector<double,_10>_> *this_01;
  TPZVec<TPZFNMatrix<30,_double>_> *this_02;
  long *plVar5;
  TPZCompMesh *pTVar6;
  TPZFMatrix<double> *this_03;
  int64_t iVar7;
  TPZManVector<double,_10> *pTVar8;
  TPZFNMatrix<30,_double> *pTVar9;
  int64_t iVar10;
  TPZConnect *this_04;
  double *pdVar11;
  long in_RSI;
  long *in_RDI;
  double row;
  TPZSolutionMatrix *extraout_XMM0_Qa;
  int d;
  int64_t is_1;
  int jn;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  int in;
  int64_t iv;
  int is;
  int solVecSize;
  int64_t numbersol;
  TPZFMatrix<double> *MeshSol;
  TPZBlock *block;
  int ncon;
  int nstate;
  TPZGradSolVec<double> *dsol;
  TPZSolVec<double> *sol;
  TPZFMatrix<double> *axes;
  TPZFMatrix<double> *dphix;
  TPZFMatrix<double> *phi;
  int in_stack_ffffffffffffff0c;
  TPZSolutionMatrix *in_stack_ffffffffffffff10;
  long in_stack_ffffffffffffff20;
  TPZFMatrix<double> *in_stack_ffffffffffffff30;
  int local_bc;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar12;
  double *in_stack_ffffffffffffff58;
  long index;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar13;
  int local_74;
  long local_70;
  int local_60;
  
  this_00 = (TPZBaseMatrix *)(in_RSI + 0x3a38);
  this_01 = (TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0);
  this_02 = (TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0);
  plVar5 = (long *)(**(code **)(*in_RDI + 0xb8))();
  iVar2 = (**(code **)(*plVar5 + 0x78))();
  iVar3 = (**(code **)(*in_RDI + 0x90))();
  pTVar6 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  TPZCompMesh::Block(pTVar6);
  pTVar6 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  TPZCompMesh::Solution(pTVar6);
  this_03 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff10);
  iVar7 = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_03);
  local_bc = iVar2;
  if (iVar3 == 0) {
    local_bc = 0;
  }
  (*this_01->_vptr_TPZVec[4])(this_01,iVar7);
  (*this_02->_vptr_TPZVec[4])(this_02,iVar7);
  for (local_60 = 0; local_60 < iVar7; local_60 = local_60 + 1) {
    pTVar8 = TPZVec<TPZManVector<double,_10>_>::operator[](this_01,(long)local_60);
    (*(pTVar8->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar8,(long)local_bc);
    TPZVec<TPZManVector<double,_10>_>::operator[](this_01,(long)local_60);
    TPZVec<double>::Fill
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(int64_t)in_RDI);
    pTVar9 = TPZVec<TPZFNMatrix<30,_double>_>::operator[](this_02,(long)local_60);
    iVar10 = TPZBaseMatrix::Rows(this_00);
    (*(pTVar9->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar9,iVar10,(long)local_bc);
    pTVar9 = TPZVec<TPZFNMatrix<30,_double>_>::operator[](this_02,(long)local_60);
    (*(pTVar9->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xf])();
  }
  local_70 = 0;
  for (local_74 = 0; local_74 < iVar3; local_74 = local_74 + 1) {
    this_04 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_74);
    TPZConnect::SequenceNumber(this_04);
    iVar4 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    for (iVar13 = 0; iVar13 < iVar4; iVar13 = iVar13 + 1) {
      for (index = 0; index < iVar7; index = index + 1) {
        row = (double)(**(code **)(*(long *)(in_RSI + 0x3900) + 0x108))
                                ((long *)(in_RSI + 0x3900),local_70 / (long)iVar2,0);
        pdVar11 = TPZFMatrix<double>::operator()
                            (in_stack_ffffffffffffff30,(int64_t)row,in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff30 = (TPZFMatrix<double> *)*pdVar11;
        pTVar8 = TPZVec<TPZManVector<double,_10>_>::operator[](this_01,index);
        pdVar11 = TPZVec<double>::operator[](&pTVar8->super_TPZVec<double>,local_70 % (long)iVar2);
        *pdVar11 = row * (double)in_stack_ffffffffffffff30 + *pdVar11;
        iVar12 = 0;
        while( true ) {
          in_stack_ffffffffffffff20 = (long)iVar12;
          iVar10 = TPZBaseMatrix::Rows(this_00);
          if (iVar10 <= in_stack_ffffffffffffff20) break;
          (*(this_00->super_TPZSavable)._vptr_TPZSavable[0x21])
                    (this_00,(long)iVar12,local_70 / (long)iVar2);
          in_stack_ffffffffffffff10 = extraout_XMM0_Qa;
          pdVar11 = TPZFMatrix<double>::operator()
                              (in_stack_ffffffffffffff30,(int64_t)row,in_stack_ffffffffffffff20);
          dVar1 = *pdVar11;
          TPZVec<TPZFNMatrix<30,_double>_>::operator[](this_02,index);
          pdVar11 = TPZFMatrix<double>::operator()
                              (in_stack_ffffffffffffff30,(int64_t)row,in_stack_ffffffffffffff20);
          *pdVar11 = (double)in_stack_ffffffffffffff10 * dVar1 + *pdVar11;
          iVar12 = iVar12 + 1;
        }
      }
      local_70 = local_70 + 1;
    }
  }
  return;
}

Assistant:

void TPZInterpolationSpace::ReallyComputeSolutionT(TPZMaterialDataT<TVar>& data){
    const TPZFMatrix<REAL> &phi = data.phi;
    const TPZFMatrix<REAL> &dphix = data.dphix;
    const TPZFMatrix<REAL> &axes = data.axes;
    TPZSolVec<TVar> &sol = data.sol;
    TPZGradSolVec<TVar> &dsol = data.dsol;
	const int nstate = this->Material()->NStateVariables();
	const int ncon = this->NConnects();
	TPZBlock &block = Mesh()->Block();
	TPZFMatrix<TVar> &MeshSol = Mesh()->Solution();
    const int64_t numbersol = MeshSol.Cols();
	
	const int solVecSize = ncon? nstate : 0;
	
    sol.resize(numbersol);
    dsol.resize(numbersol);
    for (int is = 0; is<numbersol; is++) {
        sol[is].Resize(solVecSize);
        sol[is].Fill(0.);
        dsol[is].Redim(dphix.Rows(), solVecSize);
        dsol[is].Zero();
    }	
	int64_t iv = 0;
	for(int in=0; in<ncon; in++) {
		TPZConnect *df = &Connect(in);
		const int64_t dfseq = df->SequenceNumber();
		const int dfvar = block.Size(dfseq);
		const int64_t pos = block.Position(dfseq);
		for(int jn=0; jn<dfvar; jn++) {
            for (int64_t is=0; is<numbersol; is++) {
                sol[is][iv%nstate] +=
                    (TVar)phi.Get(iv/nstate,0)*MeshSol(pos+jn,is);
                for(auto d=0; d<dphix.Rows(); d++){
                    dsol[is](d,iv%nstate) +=
                        (TVar)dphix.Get(d,iv/nstate)*MeshSol(pos+jn,is);
                }
            }
			iv++;
		}
	}
	
}